

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

void __thiscall
google::protobuf::EncodedDescriptorDatabase::EncodedDescriptorDatabase
          (EncodedDescriptorDatabase *this)

{
  EncodedDescriptorDatabase *this_local;
  
  DescriptorDatabase::DescriptorDatabase(&this->super_DescriptorDatabase);
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__EncodedDescriptorDatabase_00411a30;
  SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::DescriptorIndex
            (&this->index_);
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->files_to_delete_);
  return;
}

Assistant:

EncodedDescriptorDatabase::EncodedDescriptorDatabase() {}